

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O0

bool __thiscall
tinyusdz::GeomPrimvar::get_value<tinyusdz::value::matrix2d>
          (GeomPrimvar *this,double timecode,matrix2d *dest,TimeSampleInterpolationType interp,
          string *err)

{
  bool bVar1;
  uint32_t tyid;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  string local_128;
  uint32_t local_108;
  allocator local_101;
  string local_100 [32];
  string local_e0;
  undefined1 local_c0 [8];
  matrix2d value;
  allocator local_79;
  string local_78 [32];
  fmt local_58 [32];
  string *local_38;
  string *err_local;
  matrix2d *pmStack_28;
  TimeSampleInterpolationType interp_local;
  matrix2d *dest_local;
  double timecode_local;
  GeomPrimvar *this_local;
  
  local_38 = err;
  err_local._4_4_ = interp;
  pmStack_28 = dest;
  dest_local = (matrix2d *)timecode;
  timecode_local = (double)this;
  if (dest == (matrix2d *)0x0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::operator+=((string *)err,"Output value is nullptr.");
    }
    this_local._7_1_ = false;
  }
  else {
    bVar1 = Attribute::is_blocked(&this->_attr);
    if (bVar1) {
      if (local_38 != (string *)0x0) {
        ::std::__cxx11::string::operator+=((string *)local_38,"Attribute is blocked.");
      }
      this_local._7_1_ = false;
    }
    else {
      tyid = Attribute::type_id(&this->_attr);
      bVar1 = IsSupportedGeomPrimvarType(tyid);
      if (bVar1) {
        tinyusdz::value::matrix2d::matrix2d((matrix2d *)local_c0);
        bVar1 = Attribute::get_value<tinyusdz::value::matrix2d>
                          (&this->_attr,(double)dest_local,(matrix2d *)local_c0,err_local._4_4_);
        if (bVar1) {
          pmStack_28->m[0][0] = (double)local_c0;
          pmStack_28->m[0][1] = value.m[0][0];
          pmStack_28->m[1][0] = value.m[0][1];
          pmStack_28->m[1][1] = value.m[1][0];
          this_local._7_1_ = true;
        }
        else {
          if (local_38 != (string *)0x0) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      (local_100,
                       "Get Attribute value at time {} failed. Maybe type mismatch?. Requested type `{}` but Attribute has type `{}`"
                       ,&local_101);
            local_108 = tinyusdz::value::TypeTraits<tinyusdz::value::matrix2d>::type_id();
            Attribute::type_name_abi_cxx11_(&local_128,&this->_attr);
            fmt::format<double,unsigned_int,std::__cxx11::string>
                      (&local_e0,(fmt *)local_100,(string *)&dest_local,(double *)&local_108,
                       (uint *)&local_128,in_R9);
            ::std::__cxx11::string::operator+=((string *)local_38,(string *)&local_e0);
            ::std::__cxx11::string::~string((string *)&local_e0);
            ::std::__cxx11::string::~string((string *)&local_128);
            ::std::__cxx11::string::~string(local_100);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_101);
          }
          this_local._7_1_ = false;
        }
      }
      else {
        if (local_38 != (string *)0x0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_78,"Unsupported type for GeomPrimvar. type = `{}`",&local_79);
          Attribute::type_name_abi_cxx11_((string *)(value.m[1] + 1),&this->_attr);
          fmt::format<std::__cxx11::string>
                    (local_58,(string *)local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (value.m[1] + 1));
          ::std::__cxx11::string::operator+=((string *)local_38,(string *)local_58);
          ::std::__cxx11::string::~string((string *)local_58);
          ::std::__cxx11::string::~string((string *)(value.m[1] + 1));
          ::std::__cxx11::string::~string(local_78);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_79);
        }
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool GeomPrimvar::get_value(double timecode, T *dest, value::TimeSampleInterpolationType interp, std::string *err) const {
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<value::token>::type_id(), "`token` type is not supported as a GeomPrimvar");
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<std::vector<value::token>>::type_id(), "`token[]` type is not supported as a GeomPrimvar");

  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  if (_attr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is blocked.";
    }
    return false;
  }

  if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
    if (err) {
      (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                            _attr.type_name());
    }
    return false;
  }

#if 0
  if (value::TimeCode(timecode).is_default()) {

    if (_attr.has_value()) {
      if (auto pv = _attr.get_value<T>()) {

        // copy
        (*dest) = pv.value();
        return true;

      } else {
        if (err) {
          (*err) += fmt::format("Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`", value::TypeTraits<T>::type_id(), _attr.type_name());
        }
        return false;
      }
    }

  }

  if (_attr.has_timesamples()) {
    T value;

    if (!_attr.get_value(timecode, &value, interp)) {
      if (err) {
        (*err) += fmt::format("Get Attribute value at time {} failed. Maybe type mismatch?. Requested type `{}` but Attribute has type `{}`", timecode, value::TypeTraits<T>::type_id(), _attr.type_name());
      }
      return false;
    }

    // copy
    (*dest) = value;
    return true;
  }

  return false;
#else
  T value{};

  if (!_attr.get_value(timecode, &value, interp)) {
    if (err) {
      (*err) += fmt::format("Get Attribute value at time {} failed. Maybe type mismatch?. Requested type `{}` but Attribute has type `{}`", timecode, value::TypeTraits<T>::type_id(), _attr.type_name());
    }
    return false;
  }

  // copy
  (*dest) = value;
  return true;
#endif

}